

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O1

compile_errcode __thiscall StatementList::Parse(StatementList *this)

{
  compile_errcode cVar1;
  
  SymbolQueue::SetCacheLocate(handle_symbol_queue);
  while( true ) {
    cVar1 = Statement::Parse(&this->m_statement);
    if (cVar1 != 0) break;
    Statement::LogOutput(&this->m_statement);
    SymbolQueue::SetCacheLocate(handle_symbol_queue);
  }
  SymbolQueue::SetCurrentLocate(handle_symbol_queue);
  return 0;
}

Assistant:

compile_errcode StatementList::Parse() {
    int ret = COMPILE_OK;
    while (true) {
        handle_symbol_queue->SetCacheLocate();
        if ((ret = m_statement.Parse()) == COMPILE_OK) {
            m_statement.LogOutput();
        } else {
            handle_symbol_queue->SetCurrentLocate();
            return COMPILE_OK;
        }
    }
}